

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

Node * __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::CharacterClassPass1<true>
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this)

{
  code *pcVar1;
  CharSet<char16_t> *pCVar2;
  bool bVar3;
  EncodedChar EVar4;
  Char CVar5;
  uint uVar6;
  uint uVar7;
  undefined4 *puVar8;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar9;
  Parser<UTF8EncodingPolicyBase<false>,_false> *pPVar10;
  ScriptConfiguration *this_00;
  MatchSetNode *pMVar11;
  AltNode *this_01;
  Parser<UTF8EncodingPolicyBase<false>,_false> *local_c58;
  bool local_b91;
  bool local_b59;
  TrackAllocData local_b40;
  Char local_b14;
  Char local_b10;
  codepoint_t upperCharOfRange;
  codepoint_t lowerCharOfRange;
  codepoint_t charRangeSearchIndex;
  AltNode *currentTail;
  undefined8 local_af8;
  TrackAllocData local_af0;
  Parser<UTF8EncodingPolicyBase<false>,_false> *local_ac8;
  AltNode *headToReturn;
  undefined8 local_ab8;
  TrackAllocData local_ab0;
  code *local_a88;
  undefined8 local_a80;
  TrackAllocData local_a78;
  MatchSetNode *local_a50;
  MatchSetNode *node_1;
  undefined8 local_a40;
  TrackAllocData local_a38;
  MatchSetNode *local_a10;
  MatchSetNode *node;
  undefined8 local_a00;
  TrackAllocData local_9f8;
  Parser<UTF8EncodingPolicyBase<false>,_false> *local_9d0;
  MatchSetNode *simpleToReturn_1;
  uint simpleCharsCount;
  uint totalCodePointsCount;
  CharSet<unsigned_int> caseEquivalent;
  CharSet<unsigned_int> negatedSet;
  char16 upperSurrogate;
  char16 lowerSurrogate;
  TrackAllocData local_458;
  Parser<UTF8EncodingPolicyBase<false>,_false> *local_430;
  Node *toReturn;
  codepoint_t singleton;
  bool isSingleton;
  CharSet<unsigned_int> *toUseForTranslation;
  Node *suffixNode;
  Node *prefixNode;
  undefined8 local_400;
  TrackAllocData local_3f8;
  code *local_3d0;
  undefined8 local_3c8;
  TrackAllocData local_3c0;
  Parser<UTF8EncodingPolicyBase<false>,_false> *local_398;
  MatchSetNode *simpleToReturn;
  Node *returnedNode;
  codepoint_t codePointToSet;
  uint uStack_37c;
  bool prevprevWasACharSetAndPartOfRange;
  bool prevWasACharSetAndPartOfRange;
  bool currIsACharSet;
  bool previousWasASurrogate;
  EncodedChar nextChar;
  codepoint_t pendingRangeStart;
  codepoint_t pendingCodePoint;
  bool isNegation;
  MatchCharNode deferredCharNode;
  MatchSetNode deferredSetNode;
  CharSet<unsigned_int> codePointSet;
  Parser<UTF8EncodingPolicyBase<false>,_false> *this_local;
  
  if ((this->unicodeFlagPresent & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x842,"(containsSurrogates ? unicodeFlagPresent : true)",
                       "containsSurrogates ? unicodeFlagPresent : true");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  CharSet<unsigned_int>::CharSet
            ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6));
  MatchSetNode::MatchSetNode((MatchSetNode *)&deferredCharNode.isEquivClass,false,false);
  MatchCharNode::MatchCharNode((MatchCharNode *)&pendingCodePoint,L'\0');
  pendingRangeStart._3_1_ = 0;
  EVar4 = ECLookahead(this,0);
  if (EVar4 == '^') {
    pendingRangeStart._3_1_ = 1;
    ECConsume(this,1);
  }
  _prevWasACharSetAndPartOfRange = 0xffffffff;
  uStack_37c = 0xffffffff;
  codePointToSet._3_1_ = ECLookahead(this,0);
  codePointToSet._2_1_ = 0;
  codePointToSet._0_1_ = false;
  returnedNode._7_1_ = 0;
  do {
    codePointToSet._1_1_ = 0;
    if (codePointToSet._3_1_ == ']') {
      if (_prevWasACharSetAndPartOfRange != 0xffffffff) {
        CharSet<unsigned_int>::Set
                  ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                   this->ctAllocator,_prevWasACharSetAndPartOfRange);
      }
      if ((this->unicodeFlagPresent & 1U) == 0) {
        uVar6 = CharSet<unsigned_int>::SimpleCharCount
                          ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6));
        uVar7 = CharSet<unsigned_int>::Count
                          ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6));
        if (uVar6 != uVar7) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x8e2,"(codePointSet.SimpleCharCount() == codePointSet.Count())",
                             "codePointSet.SimpleCharCount() == codePointSet.Count()");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        pAVar9 = &this->ctAllocator->
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_3c0,(type_info *)&MatchSetNode::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                   ,0x8e3);
        pAVar9 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo(pAVar9,&local_3c0);
        local_3d0 = Memory::ArenaAllocator::Alloc;
        local_3c8 = 0;
        pPVar10 = (Parser<UTF8EncodingPolicyBase<false>,_false> *)
                  new<Memory::ArenaAllocator>(0x68,(ArenaAllocator *)pAVar9,0x3f67b0);
        MatchSetNode::MatchSetNode((MatchSetNode *)pPVar10,(bool)(pendingRangeStart._3_1_ & 1),true)
        ;
        local_398 = pPVar10;
        CharSet<unsigned_int>::CloneSimpleCharsTo
                  ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                   this->ctAllocator,(CharSet<char16_t> *)&pPVar10->inputLim);
        this_local = local_398;
      }
      else {
        this_00 = Js::ScriptContext::GetConfig(this->scriptContext);
        bVar3 = Js::ScriptConfiguration::IsES6UnicodeExtensionsEnabled(this_00);
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x8e9,"(scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())",
                             "scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled()");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        bVar3 = CharSet<unsigned_int>::IsEmpty
                          ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6));
        if (bVar3) {
          pAVar9 = &this->ctAllocator->
                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_3f8,(type_info *)&MatchSetNode::typeinfo,0,0xffffffffffffffff,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                     ,0x8ed);
          pAVar9 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                   TrackAllocInfo(pAVar9,&local_3f8);
          prefixNode = (Node *)Memory::ArenaAllocator::Alloc;
          local_400 = 0;
          this_local = (Parser<UTF8EncodingPolicyBase<false>,_false> *)
                       new<Memory::ArenaAllocator>(0x68,(ArenaAllocator *)pAVar9,0x3f67b0);
          MatchSetNode::MatchSetNode((MatchSetNode *)this_local,false,false);
        }
        else {
          suffixNode = (Node *)0x0;
          toUseForTranslation = (CharSet<unsigned_int> *)0x0;
          _singleton = (uint32 *)((long)&deferredSetNode.set.rep + 0x20);
          local_b91 = false;
          if (((this->caseInsensitiveFlagPresent & 1U) == 0) &&
             (local_b91 = false, (pendingRangeStart._3_1_ & 1) == 0)) {
            local_b91 = CharSet<unsigned_int>::IsSingleton
                                  ((CharSet<unsigned_int> *)
                                   (deferredSetNode.set.rep.full.direct.vec + 6));
          }
          toReturn._7_1_ = local_b91;
          if (local_b91 == false) {
            CharSet<unsigned_int>::CharSet
                      ((CharSet<unsigned_int> *)
                       (caseEquivalent.characterPlanes[0x10].rep.full.direct.vec + 6));
            if ((this->caseInsensitiveFlagPresent & 1U) == 0) {
              if ((pendingRangeStart._3_1_ & 1) != 0) {
                CharSet<unsigned_int>::ToComplement
                          ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                           this->ctAllocator,
                           (CharSet<unsigned_int> *)
                           (caseEquivalent.characterPlanes[0x10].rep.full.direct.vec + 6));
              }
              if ((pendingRangeStart._3_1_ & 1) == 0) {
                pCVar2 = &deferredSetNode.set;
              }
              else {
                pCVar2 = caseEquivalent.characterPlanes + 0x10;
              }
              _singleton = (uint32 *)((long)(pCVar2->rep).full.direct.vec + 0x18);
              if ((pendingRangeStart._3_1_ & 1) != 0) {
                CharSet<unsigned_int>::FreeBody
                          ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                           this->ctAllocator);
              }
            }
            else {
              CharSet<unsigned_int>::CharSet((CharSet<unsigned_int> *)&simpleCharsCount);
              CharSet<unsigned_int>::ToEquivClass
                        ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                         this->ctAllocator,(CharSet<unsigned_int> *)&simpleCharsCount);
              uVar6 = CharSet<unsigned_int>::Count((CharSet<unsigned_int> *)&simpleCharsCount);
              uVar7 = CharSet<unsigned_int>::Count
                                ((CharSet<unsigned_int> *)
                                 (deferredSetNode.set.rep.full.direct.vec + 6));
              if (uVar6 < uVar7) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar8 = 1;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                   ,0x925,"(caseEquivalent.Count() >= codePointSet.Count())",
                                   "caseEquivalent.Count() >= codePointSet.Count()");
                if (!bVar3) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar8 = 0;
              }
              if ((pendingRangeStart._3_1_ & 1) == 0) {
                CharSet<unsigned_int>::CloneFrom
                          ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                           this->ctAllocator,(CharSet<unsigned_int> *)&simpleCharsCount);
              }
              else {
                CharSet<unsigned_int>::Clear
                          ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                           this->ctAllocator);
                CharSet<unsigned_int>::ToComplement
                          ((CharSet<unsigned_int> *)&simpleCharsCount,this->ctAllocator,
                           (CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6));
                CharSet<unsigned_int>::FreeBody
                          ((CharSet<unsigned_int> *)&simpleCharsCount,this->ctAllocator);
              }
              if (_singleton != (uint32 *)((long)&deferredSetNode.set.rep + 0x20)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar8 = 1;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                   ,0x935,"(toUseForTranslation == &codePointSet)",
                                   "toUseForTranslation == &codePointSet");
                if (!bVar3) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar8 = 0;
              }
            }
            simpleToReturn_1._4_4_ =
                 CharSet<unsigned_int>::Count((CharSet<unsigned_int> *)_singleton);
            simpleToReturn_1._0_4_ =
                 CharSet<unsigned_int>::SimpleCharCount((CharSet<unsigned_int> *)_singleton);
            if (simpleToReturn_1._4_4_ == (uint)simpleToReturn_1) {
              pAVar9 = &this->ctAllocator->
                        super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
              Memory::TrackAllocData::CreateTrackAllocData
                        (&local_9f8,(type_info *)&MatchSetNode::typeinfo,0,0xffffffffffffffff,
                         "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x93c);
              pAVar9 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                       TrackAllocInfo(pAVar9,&local_9f8);
              node = (MatchSetNode *)Memory::ArenaAllocator::Alloc;
              local_a00 = 0;
              pPVar10 = (Parser<UTF8EncodingPolicyBase<false>,_false> *)
                        new<Memory::ArenaAllocator>(0x68,(ArenaAllocator *)pAVar9,0x3f67b0);
              MatchSetNode::MatchSetNode
                        ((MatchSetNode *)pPVar10,(bool)(pendingRangeStart._3_1_ & 1),true);
              local_9d0 = pPVar10;
              CharSet<unsigned_int>::CloneSimpleCharsTo
                        ((CharSet<unsigned_int> *)_singleton,this->ctAllocator,
                         (CharSet<char16_t> *)&pPVar10->inputLim);
              this_local = local_9d0;
            }
            else {
              if ((uint)simpleToReturn_1 != 0) {
                bVar3 = CharSet<unsigned_int>::ContainSurrogateCodeUnits
                                  ((CharSet<unsigned_int> *)_singleton);
                if (bVar3) {
                  pAVar9 = &this->ctAllocator->
                            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                  ;
                  Memory::TrackAllocData::CreateTrackAllocData
                            (&local_a78,(type_info *)&MatchSetNode::typeinfo,0,0xffffffffffffffff,
                             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x94b);
                  pAVar9 = Memory::
                           ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                           TrackAllocInfo(pAVar9,&local_a78);
                  local_a88 = Memory::ArenaAllocator::Alloc;
                  local_a80 = 0;
                  pMVar11 = (MatchSetNode *)
                            new<Memory::ArenaAllocator>(0x68,(ArenaAllocator *)pAVar9,0x3f67b0);
                  MatchSetNode::MatchSetNode(pMVar11,false,false);
                  local_a50 = pMVar11;
                  CharSet<unsigned_int>::CloneNonSurrogateCodeUnitsTo
                            ((CharSet<unsigned_int> *)_singleton,this->ctAllocator,&pMVar11->set);
                  suffixNode = &local_a50->super_Node;
                  pAVar9 = &this->ctAllocator->
                            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                  ;
                  Memory::TrackAllocData::CreateTrackAllocData
                            (&local_ab0,(type_info *)&MatchSetNode::typeinfo,0,0xffffffffffffffff,
                             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x94e);
                  pAVar9 = Memory::
                           ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                           TrackAllocInfo(pAVar9,&local_ab0);
                  headToReturn = (AltNode *)Memory::ArenaAllocator::Alloc;
                  local_ab8 = 0;
                  pMVar11 = (MatchSetNode *)
                            new<Memory::ArenaAllocator>(0x68,(ArenaAllocator *)pAVar9,0x3f67b0);
                  MatchSetNode::MatchSetNode(pMVar11,false,false);
                  local_a50 = pMVar11;
                  CharSet<unsigned_int>::CloneSurrogateCodeUnitsTo
                            ((CharSet<unsigned_int> *)_singleton,this->ctAllocator,&pMVar11->set);
                  toUseForTranslation = (CharSet<unsigned_int> *)local_a50;
                }
                else {
                  pAVar9 = &this->ctAllocator->
                            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                  ;
                  Memory::TrackAllocData::CreateTrackAllocData
                            (&local_a38,(type_info *)&MatchSetNode::typeinfo,0,0xffffffffffffffff,
                             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x945);
                  pAVar9 = Memory::
                           ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                           TrackAllocInfo(pAVar9,&local_a38);
                  node_1 = (MatchSetNode *)Memory::ArenaAllocator::Alloc;
                  local_a40 = 0;
                  pMVar11 = (MatchSetNode *)
                            new<Memory::ArenaAllocator>(0x68,(ArenaAllocator *)pAVar9,0x3f67b0);
                  MatchSetNode::MatchSetNode(pMVar11,false,false);
                  local_a10 = pMVar11;
                  CharSet<unsigned_int>::CloneSimpleCharsTo
                            ((CharSet<unsigned_int> *)_singleton,this->ctAllocator,&pMVar11->set);
                  suffixNode = &local_a10->super_Node;
                }
              }
              if ((this->unicodeFlagPresent & 1U) == 0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar8 = 1;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                   ,0x954,"(unicodeFlagPresent)","unicodeFlagPresent");
                if (!bVar3) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar8 = 0;
              }
              if (suffixNode == (Node *)0x0) {
                local_c58 = (Parser<UTF8EncodingPolicyBase<false>,_false> *)0x0;
              }
              else {
                pAVar9 = &this->ctAllocator->
                          super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
                Memory::TrackAllocData::CreateTrackAllocData
                          (&local_af0,(type_info *)&AltNode::typeinfo,0,0xffffffffffffffff,
                           "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x955);
                pAVar9 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                         ::TrackAllocInfo(pAVar9,&local_af0);
                currentTail = (AltNode *)Memory::ArenaAllocator::Alloc;
                local_af8 = 0;
                local_c58 = (Parser<UTF8EncodingPolicyBase<false>,_false> *)
                            new<Memory::ArenaAllocator>(0x60,(ArenaAllocator *)pAVar9,0x3f67b0);
                AltNode::AltNode((AltNode *)local_c58,suffixNode,(AltNode *)0x0);
              }
              local_ac8 = local_c58;
              _lowerCharOfRange = local_c58;
              upperCharOfRange = 0x10000;
              local_b10 = 0;
              local_b14 = 0;
              while (bVar3 = CharSet<unsigned_int>::GetNextRange
                                       ((CharSet<unsigned_int> *)_singleton,upperCharOfRange,
                                        &local_b10,&local_b14), bVar3) {
                if (local_b10 == local_b14) {
                  _lowerCharOfRange =
                       (Parser<UTF8EncodingPolicyBase<false>,_false> *)
                       AppendSurrogatePairToDisjunction(this,local_b10,(AltNode *)_lowerCharOfRange)
                  ;
                }
                else {
                  _lowerCharOfRange =
                       (Parser<UTF8EncodingPolicyBase<false>,_false> *)
                       AppendSurrogateRangeToDisjunction
                                 (this,local_b10,local_b14,(AltNode *)_lowerCharOfRange);
                }
                if (local_ac8 == (Parser<UTF8EncodingPolicyBase<false>,_false> *)0x0) {
                  local_ac8 = _lowerCharOfRange;
                }
                if (_lowerCharOfRange == (Parser<UTF8EncodingPolicyBase<false>,_false> *)0x0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar8 = 1;
                  bVar3 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                     ,0x96a,"(currentTail != nullptr)","currentTail != nullptr");
                  if (!bVar3) {
                    pcVar1 = (code *)invalidInstructionException();
                    (*pcVar1)();
                  }
                  puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar8 = 0;
                }
                for (; (AltNode *)_lowerCharOfRange->inputLim != (AltNode *)0x0;
                    _lowerCharOfRange =
                         (Parser<UTF8EncodingPolicyBase<false>,_false> *)_lowerCharOfRange->inputLim
                    ) {
                }
                upperCharOfRange = local_b14 + 1;
              }
              if (toUseForTranslation != (CharSet<unsigned_int> *)0x0) {
                pAVar9 = &this->ctAllocator->
                          super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
                Memory::TrackAllocData::CreateTrackAllocData
                          (&local_b40,(type_info *)&AltNode::typeinfo,0,0xffffffffffffffff,
                           "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x974);
                pAVar9 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                         ::TrackAllocInfo(pAVar9,&local_b40);
                this_01 = (AltNode *)
                          new<Memory::ArenaAllocator>(0x60,(ArenaAllocator *)pAVar9,0x3f67b0);
                AltNode::AltNode(this_01,(Node *)toUseForTranslation,(AltNode *)0x0);
                _lowerCharOfRange->inputLim = (EncodedChar *)this_01;
              }
              CharSet<unsigned_int>::Clear((CharSet<unsigned_int> *)_singleton,this->ctAllocator);
              if ((local_ac8 == (Parser<UTF8EncodingPolicyBase<false>,_false> *)0x0) ||
                 ((AltNode *)local_ac8->inputLim != (AltNode *)0x0)) {
                this_local = local_ac8;
              }
              else {
                this_local = (Parser<UTF8EncodingPolicyBase<false>,_false> *)local_ac8->input;
              }
            }
          }
          else {
            toReturn._0_4_ =
                 CharSet<unsigned_int>::Singleton
                           ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6));
            local_430 = (Parser<UTF8EncodingPolicyBase<false>,_false> *)0x0;
            if ((codepoint_t)toReturn < 0x10000) {
              pAVar9 = &this->ctAllocator->
                        super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
              Memory::TrackAllocData::CreateTrackAllocData
                        (&local_458,(type_info *)&MatchCharNode::typeinfo,0,0xffffffffffffffff,
                         "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x8fe);
              pAVar9 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                       TrackAllocInfo(pAVar9,&local_458);
              pPVar10 = (Parser<UTF8EncodingPolicyBase<false>,_false> *)
                        new<Memory::ArenaAllocator>(0x48,(ArenaAllocator *)pAVar9,0x3f67b0);
              MatchCharNode::MatchCharNode((MatchCharNode *)pPVar10,(Char)(codepoint_t)toReturn);
              local_430 = pPVar10;
            }
            else {
              if ((this->unicodeFlagPresent & 1U) == 0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar8 = 1;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                   ,0x902,"(unicodeFlagPresent)","unicodeFlagPresent");
                if (!bVar3) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar8 = 0;
              }
              Js::NumberUtilities::CodePointAsSurrogatePair
                        ((codepoint_t)toReturn,
                         (char16 *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 0xe),
                         (char16 *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 0xc));
              local_430 = (Parser<UTF8EncodingPolicyBase<false>,_false> *)
                          CreateSurrogatePairAtom
                                    (this,negatedSet.characterPlanes[0x10].rep.full.direct.vec[7].
                                          _2_2_,
                                     negatedSet.characterPlanes[0x10].rep.full.direct.vec[7]._0_2_);
            }
            CharSet<unsigned_int>::Clear
                      ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                       this->ctAllocator);
            this_local = local_430;
          }
        }
      }
      return (Node *)this_local;
    }
    returnedNode._0_4_ = 0xffffffff;
    if (codePointToSet._3_1_ == '\\') {
      ECConsume(this,1);
    }
    if ((this->currentSurrogatePairNode == (SurrogatePairTracker *)0x0) ||
       (this->currentSurrogatePairNode->location != this->next)) {
      if (codePointToSet._3_1_ == '\\') {
        simpleToReturn =
             (MatchSetNode *)
             ClassEscapePass1(this,(MatchCharNode *)&pendingCodePoint,
                              (MatchSetNode *)&deferredCharNode.isEquivClass,
                              (bool *)((long)&codePointToSet + 2));
        returnedNode._0_4_ = _prevWasACharSetAndPartOfRange;
        if ((simpleToReturn->super_Node).tag == MatchSet) {
          if (uStack_37c != 0xffffffff) {
            if ((this->unicodeFlagPresent & 1U) != 0) {
              Fail(this,-0x7ff5e9d3);
            }
            CharSet<unsigned_int>::Set
                      ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                       this->ctAllocator,0x2d);
          }
          _prevWasACharSetAndPartOfRange = 0xffffffff;
          uStack_37c = 0xffffffff;
          CharSet<unsigned_int>::UnionInPlace
                    ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                     this->ctAllocator,(CharSet<char16_t> *)&deferredSetNode.isNegation);
          codePointToSet._1_1_ = 1;
        }
        else {
          _prevWasACharSetAndPartOfRange =
               (codepoint_t)(ushort)deferredCharNode.super_Node.followConsumes.lower;
        }
      }
      else if (codePointToSet._3_1_ == '-') {
        if (((uStack_37c == 0xffffffff) && (_prevWasACharSetAndPartOfRange != 0xffffffff)) &&
           (EVar4 = ECLookahead(this,1), EVar4 != ']')) {
          uStack_37c = _prevWasACharSetAndPartOfRange;
          ECConsume(this,1);
        }
        else {
          returnedNode._0_4_ = _prevWasACharSetAndPartOfRange;
          _prevWasACharSetAndPartOfRange = 0x2d;
          ECConsume(this,1);
        }
      }
      else {
        returnedNode._0_4_ = _prevWasACharSetAndPartOfRange;
        CVar5 = NextChar(this);
        _prevWasACharSetAndPartOfRange = (codepoint_t)(ushort)CVar5;
      }
    }
    else {
      returnedNode._0_4_ = _prevWasACharSetAndPartOfRange;
      _prevWasACharSetAndPartOfRange = this->currentSurrogatePairNode->value;
      bVar3 = ECCanConsume(this,this->currentSurrogatePairNode->length);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x86b,"(ECCanConsume(this->currentSurrogatePairNode->length))",
                           "ECCanConsume(this->currentSurrogatePairNode->length)");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      ECConsumeMultiUnit(this,this->currentSurrogatePairNode->length);
      UTF8EncodingPolicyBase<false>::RestoreMultiUnits
                (&this->super_UTF8EncodingPolicyBase<false>,
                 this->currentSurrogatePairNode->multiUnits);
      this->currentSurrogatePairNode = this->currentSurrogatePairNode->next;
    }
    if (((Char)returnedNode != 0xffffffff) || ((returnedNode._7_1_ & 1) != 0)) {
      if ((returnedNode._7_1_ & 1) == 0) {
        if (uStack_37c == 0xffffffff) {
          CharSet<unsigned_int>::Set
                    ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                     this->ctAllocator,(Char)returnedNode);
        }
        else {
          if (_prevWasACharSetAndPartOfRange < uStack_37c) {
            if ((this->unicodeFlagPresent & 1U) != 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar8 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                 ,0x8bd,"(!unicodeFlagPresent)","!unicodeFlagPresent");
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar8 = 0;
            }
            Fail(this,-0x7ff5ec63);
          }
          CharSet<unsigned_int>::SetRange
                    ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                     this->ctAllocator,uStack_37c,_prevWasACharSetAndPartOfRange);
          _prevWasACharSetAndPartOfRange = 0xffffffff;
          uStack_37c = 0xffffffff;
        }
      }
      else {
        if ((this->unicodeFlagPresent & 1U) != 0) {
          Fail(this,-0x7ff5e9d3);
        }
        if (_prevWasACharSetAndPartOfRange != 0xffffffff) {
          CharSet<unsigned_int>::Set
                    ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                     this->ctAllocator,_prevWasACharSetAndPartOfRange);
        }
        CharSet<unsigned_int>::Set
                  ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                   this->ctAllocator,0x2d);
        _prevWasACharSetAndPartOfRange = 0xffffffff;
        uStack_37c = 0xffffffff;
      }
    }
    codePointToSet._3_1_ = ECLookahead(this,0);
    returnedNode._7_1_ = (byte)codePointToSet & 1;
    local_b59 = (codePointToSet._1_1_ & 1) != 0 && codePointToSet._3_1_ == '-';
    codePointToSet._0_1_ = local_b59;
  } while( true );
}

Assistant:

Node* Parser<P, IsLiteral>::CharacterClassPass1()
    {
        Assert(containsSurrogates ? unicodeFlagPresent : true);

        CharSet<codepoint_t> codePointSet;

        MatchSetNode deferredSetNode(false, false);
        MatchCharNode deferredCharNode(0);

        bool isNegation = false;

        if (ECLookahead() == '^')
        {
            isNegation = true;
            ECConsume();
        }

        // We aren't expecting any terminating null characters, only embedded ones that should treated as valid characters.
        // CharacterClassPass0 should have taken care of terminating null.
        codepoint_t pendingCodePoint = INVALID_CODEPOINT;
        codepoint_t pendingRangeStart = INVALID_CODEPOINT;
        EncodedChar nextChar = ECLookahead();
        bool previousWasASurrogate = false;
        bool currIsACharSet = false;
        bool prevWasACharSetAndPartOfRange = false;
        bool prevprevWasACharSetAndPartOfRange = false;

        while(nextChar != ']')
        {
            codepoint_t codePointToSet = INVALID_CODEPOINT;

            // Consume ahead of time if we have two backslashes, both cases below (previously Tracked surrogate pair, and ClassEscapePass1) assume it is.
            if (nextChar == '\\')
            {
                ECConsume();
            }

            // These if-blocks are the logical ClassAtomPass1, they weren't grouped into a method to simplify dealing with multiple out parameters.
            if (containsSurrogates && this->currentSurrogatePairNode != nullptr && this->currentSurrogatePairNode->location == this->next)
            {
                codePointToSet = pendingCodePoint;

                pendingCodePoint = this->currentSurrogatePairNode->value;
                Assert(ECCanConsume(this->currentSurrogatePairNode->length));
                ECConsumeMultiUnit(this->currentSurrogatePairNode->length);
                this->RestoreMultiUnits(this->currentSurrogatePairNode->multiUnits);
                this->currentSurrogatePairNode = this->currentSurrogatePairNode->next;
            }
            else if (nextChar == '\\')
            {
                Node* returnedNode = ClassEscapePass1(&deferredCharNode, &deferredSetNode, previousWasASurrogate);
                codePointToSet = pendingCodePoint;

                if (returnedNode->tag == Node::MatchSet)
                {
                    if (pendingRangeStart != INVALID_CODEPOINT)
                    {
                        if (unicodeFlagPresent)
                        {
                            //A range containing a character class and the unicode flag is present, thus we end up having to throw a "Syntax" error here
                            //This breaks the notion of Pass0 check for valid syntax, because during that time, the unicode flag is unknown.
                            Fail(JSERR_UnicodeRegExpRangeContainsCharClass); //From #sec-patterns-static-semantics-early-errors-annexb
                        }

                        codePointSet.Set(ctAllocator, '-');
                    }

                    pendingCodePoint = INVALID_CODEPOINT;
                    pendingRangeStart = INVALID_CODEPOINT;
                    codePointSet.UnionInPlace(ctAllocator, deferredSetNode.set);
                    currIsACharSet = true;
                }
                else
                {
                    // Just a character
                    pendingCodePoint = deferredCharNode.cs[0];
                }
            }
            else if (nextChar == '-')
            {
                if (pendingRangeStart != INVALID_CODEPOINT || pendingCodePoint == INVALID_CODEPOINT || ECLookahead(1) == ']')
                {
                    // - is just a char, or end of a range.
                    codePointToSet = pendingCodePoint;
                    pendingCodePoint = '-';
                    ECConsume();
                }
                else
                {
                    pendingRangeStart = pendingCodePoint;
                    ECConsume();
                }
            }
            else
            {
                // Just a character, consume it
                codePointToSet = pendingCodePoint;
                pendingCodePoint = NextChar();
            }

            if (codePointToSet != INVALID_CODEPOINT || prevprevWasACharSetAndPartOfRange)
            {
                if (prevprevWasACharSetAndPartOfRange)
                {
                    //A range containing a character class and the unicode flag is present, thus we end up having to throw a "Syntax" error here
                    //This breaks the notion of Pass0 check for valid syntax, because during that time, the unicode flag is unknown.
                    if (unicodeFlagPresent)
                    {
                        Fail(JSERR_UnicodeRegExpRangeContainsCharClass);
                    }

                    if (pendingCodePoint != INVALID_CODEPOINT)
                    {
                        codePointSet.Set(ctAllocator, pendingCodePoint);
                    }

                    codePointSet.Set(ctAllocator, '-'); //Add '-' to set because a range was detected but turned out to be a union of character set with '-' and another atom.
                    pendingRangeStart = pendingCodePoint = INVALID_CODEPOINT;
                }
                else if (pendingRangeStart != INVALID_CODEPOINT)
                {
                    if (pendingRangeStart > pendingCodePoint)
                    {
                        //We have no unicodeFlag, but current range contains surrogates, thus we may end up having to throw a "Syntax" error here
                        //This breaks the notion of Pass0 check for valid syntax, because we don't know if we have a unicode option
                        Assert(!unicodeFlagPresent);
                        Fail(JSERR_RegExpBadRange);
                    }
                    
                    codePointSet.SetRange(ctAllocator, pendingRangeStart, pendingCodePoint);
                    pendingRangeStart = pendingCodePoint = INVALID_CODEPOINT;
                }
                else
                {
                    codePointSet.Set(ctAllocator, codePointToSet);
                }
            }

            nextChar = ECLookahead();
            prevprevWasACharSetAndPartOfRange = prevWasACharSetAndPartOfRange;
            prevWasACharSetAndPartOfRange = currIsACharSet && nextChar == '-';
            currIsACharSet = false;
        }

        if (pendingCodePoint != INVALID_CODEPOINT)
        {
            codePointSet.Set(ctAllocator, pendingCodePoint);
        }

        // At this point, we have a complete set of codepoints representing the range.
        // Before performing translation of any kind, we need to do some case filling.
        // At the point of this comment, there are no case mappings going cross-plane between simple
        // characters (< 0x10000) and supplementary characters (>= 0x10000)
        // However, it might still be the case, and this has to be handled.

        // On the other hand, we don't want to prevent optimizations that expect non-casefolded sets from happening.
        // At least for simple characters.

        // The simple case, is when the unicode flag isn't specified, we can go ahead and return the simple set.
        // Negations and case mappings will be handled later.
        if (!unicodeFlagPresent)
        {
            Assert(codePointSet.SimpleCharCount() == codePointSet.Count());
            MatchSetNode *simpleToReturn = Anew(ctAllocator, MatchSetNode, isNegation);
            codePointSet.CloneSimpleCharsTo(ctAllocator, simpleToReturn->set);
            return simpleToReturn;
        }

        // Everything past here must be under the flag
        Assert(scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled());

        if (codePointSet.IsEmpty())
        {
            return Anew(ctAllocator, MatchSetNode, false, false);
        }

        Node* prefixNode = nullptr;
        Node* suffixNode = nullptr;

        CharSet<codepoint_t> *toUseForTranslation = &codePointSet;

        // If a singleton, return a simple character
        bool isSingleton = !this->caseInsensitiveFlagPresent && !isNegation && codePointSet.IsSingleton();
        if (isSingleton)
        {
            codepoint_t singleton = codePointSet.Singleton();
            Node* toReturn = nullptr;

            if (singleton < 0x10000)
            {
                toReturn = Anew(ctAllocator, MatchCharNode, (char16)singleton);
            }
            else
            {
                Assert(unicodeFlagPresent);
                char16 lowerSurrogate, upperSurrogate;
                Js::NumberUtilities::CodePointAsSurrogatePair(singleton, &lowerSurrogate, &upperSurrogate);
                toReturn = CreateSurrogatePairAtom(lowerSurrogate, upperSurrogate);
            }

            codePointSet.Clear(ctAllocator);
            return toReturn;
        }

        // If negation, we want to complement the simple chars.
        // When a set is negated, optimizations skip checking if applicable, so we can go ahead and negate it here.
        CharSet<codepoint_t> negatedSet;

        if (!this->caseInsensitiveFlagPresent)
        {
            if (isNegation)
            {
                // Complement all characters, and use it as the set toTranslate
                codePointSet.ToComplement(ctAllocator, negatedSet);
            }

            toUseForTranslation = isNegation ? &negatedSet : &codePointSet;

            if (isNegation)
            {
                // Clear this, as we will no longer need this.
                codePointSet.FreeBody(ctAllocator);
            }
        }
        else
        {
            CharSet<codepoint_t> caseEquivalent;
            codePointSet.ToEquivClass(ctAllocator, caseEquivalent);
            // Equiv set can't have a reduced count of chars
            Assert(caseEquivalent.Count() >= codePointSet.Count());

            // Here we have a regex that has both case insensitive and unicode options.
            // The range might also be negated. If it is negated, we can go ahead and negate
            // the entire set as well as fill in cases, as optimizations wouldn't kick in anyways.
            if (isNegation)
            {
                codePointSet.Clear(ctAllocator);
                caseEquivalent.ToComplement(ctAllocator, codePointSet);
                caseEquivalent.FreeBody(ctAllocator);
            }
            else
            {
                codePointSet.CloneFrom(ctAllocator, caseEquivalent);
            }

            Assert(toUseForTranslation == &codePointSet);
        }

        uint totalCodePointsCount = toUseForTranslation->Count();
        uint simpleCharsCount = toUseForTranslation->SimpleCharCount();
        if (totalCodePointsCount == simpleCharsCount)
        {
            MatchSetNode *simpleToReturn = Anew(ctAllocator, MatchSetNode, isNegation);
            toUseForTranslation->CloneSimpleCharsTo(ctAllocator, simpleToReturn->set);
            return simpleToReturn;
        }

        if  (simpleCharsCount > 0)
        {
            if (!toUseForTranslation->ContainSurrogateCodeUnits())
            {
                MatchSetNode *node = Anew(ctAllocator, MatchSetNode, false, false);
                toUseForTranslation->CloneSimpleCharsTo(ctAllocator, node->set);
                prefixNode = node;
            }
            else
            {
                MatchSetNode *node = Anew(ctAllocator, MatchSetNode, false, false);
                toUseForTranslation->CloneNonSurrogateCodeUnitsTo(ctAllocator, node->set);
                prefixNode = node;
                node = Anew(ctAllocator, MatchSetNode, false, false);
                toUseForTranslation->CloneSurrogateCodeUnitsTo(ctAllocator, node->set);
                suffixNode = node;
            }
        }

        Assert(unicodeFlagPresent);
        AltNode *headToReturn = prefixNode == nullptr ? nullptr : Anew(ctAllocator, AltNode, prefixNode, nullptr);
        AltNode *currentTail = headToReturn;

        codepoint_t charRangeSearchIndex = 0x10000, lowerCharOfRange = 0, upperCharOfRange = 0;

        while (toUseForTranslation->GetNextRange(charRangeSearchIndex, &lowerCharOfRange, &upperCharOfRange))
        {
            if (lowerCharOfRange == upperCharOfRange)
            {
                currentTail = this->AppendSurrogatePairToDisjunction(lowerCharOfRange, currentTail);
            }
            else
            {
                currentTail = this->AppendSurrogateRangeToDisjunction(lowerCharOfRange, upperCharOfRange, currentTail);
            }

            if (headToReturn == nullptr)
            {
                headToReturn = currentTail;
            }

            AnalysisAssert(currentTail != nullptr);
            while (currentTail->tail != nullptr)
            {
                currentTail = currentTail->tail;
            }
            charRangeSearchIndex = upperCharOfRange + 1;
        }

        if (suffixNode != nullptr)
        {
            currentTail->tail = Anew(ctAllocator, AltNode, suffixNode, nullptr);
        }
        toUseForTranslation->Clear(ctAllocator);

        if (headToReturn != nullptr && headToReturn->tail == nullptr)
        {
            return headToReturn->head;
        }
        return headToReturn;
    }